

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void lower_bound_sorted_suite::find_odd_last(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator local_78;
  int local_6c;
  int *local_68 [2];
  int *local_58;
  int local_4c;
  int *local_48 [2];
  int *local_38;
  int local_2c;
  int *local_28;
  undefined1 local_1c [8];
  array<int,_5UL> storage;
  
  local_1c._0_4_ = 0xb;
  local_1c._4_4_ = 0x16;
  storage._M_elems[0] = 0x21;
  storage._M_elems[1] = 0x2c;
  storage._M_elems[2] = 0x37;
  pvVar1 = std::array<int,_5UL>::begin((array<int,_5UL> *)local_1c);
  pvVar2 = std::array<int,_5UL>::end((array<int,_5UL> *)local_1c);
  local_2c = 0x36;
  local_28 = vista::lower_bound_sorted<int*,int>(pvVar1,pvVar2,&local_2c);
  pvVar1 = std::array<int,_5UL>::begin((array<int,_5UL> *)local_1c);
  local_38 = std::next<int*>(pvVar1,4);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 54)",
             "std::next(storage.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x414,"void lower_bound_sorted_suite::find_odd_last()",&local_28,&local_38);
  pvVar1 = std::array<int,_5UL>::begin((array<int,_5UL> *)local_1c);
  pvVar2 = std::array<int,_5UL>::end((array<int,_5UL> *)local_1c);
  local_4c = 0x37;
  local_48[0] = vista::lower_bound_sorted<int*,int>(pvVar1,pvVar2,&local_4c);
  pvVar1 = std::array<int,_5UL>::begin((array<int,_5UL> *)local_1c);
  local_58 = std::next<int*>(pvVar1,4);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 55)",
             "std::next(storage.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x416,"void lower_bound_sorted_suite::find_odd_last()",local_48,&local_58);
  pvVar1 = std::array<int,_5UL>::begin((array<int,_5UL> *)local_1c);
  pvVar2 = std::array<int,_5UL>::end((array<int,_5UL> *)local_1c);
  local_6c = 0x38;
  local_68[0] = vista::lower_bound_sorted<int*,int>(pvVar1,pvVar2,&local_6c);
  local_78 = std::array<int,_5UL>::end((array<int,_5UL> *)local_1c);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 56)","storage.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x418,"void lower_bound_sorted_suite::find_odd_last()",local_68,&local_78);
  return;
}

Assistant:

void find_odd_last()
{
    std::array<int, 5> storage = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 54),
                  std::next(storage.begin(), 4));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 55),
                  std::next(storage.begin(), 4));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 56),
                  storage.end());
}